

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<float>::DecomposeEquations
          (TPZFrontNonSym<float> *this,int64_t mineq,int64_t maxeq,TPZEqnArray<float> *eqnarray)

{
  TPZEqnArray<float> *in_RCX;
  long in_RDX;
  long in_RSI;
  TPZEqnArray<float> *in_RDI;
  int64_t ieq;
  TPZEqnArray<float> *in_stack_00000170;
  int64_t in_stack_00000178;
  TPZFrontNonSym<float> *in_stack_00000180;
  undefined8 local_28;
  
  TPZEqnArray<float>::Reset(in_RDI);
  TPZEqnArray<float>::SetNonSymmetric(in_RCX);
  for (local_28 = in_RSI; local_28 <= in_RDX; local_28 = local_28 + 1) {
    DecomposeOneEquation(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::DecomposeEquations(int64_t mineq, int64_t maxeq, TPZEqnArray<TVar> & eqnarray){
	// message #1.1 to eqnarray:TPZEqnArray
	int64_t ieq;
	
	eqnarray.Reset();
	eqnarray.SetNonSymmetric();
	
	for (ieq = mineq; ieq <= maxeq; ieq++) {
		// message #1.2.1 to this:TPZFront
		this->DecomposeOneEquation(ieq, eqnarray);
		//			this->Print("Teste.txt",output);
	}
}